

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall
CEditor::DoButton_File
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  long lVar1;
  int iVar2;
  char *pText_00;
  long in_FS_OFFSET;
  CUIRect Label;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (Checked == 0) {
    if ((this->m_UI).m_pHotItem != pID) goto LAB_00185cf5;
    Label.w = 1.0;
    Label.h = 0.33;
    Label.x = 1.0;
    Label.y = 1.0;
  }
  else {
    Label = (CUIRect)GetButtonColor(this,pID,Checked);
  }
  CUIRect::Draw(pRect,(vec4 *)&Label,3.0,0xf);
LAB_00185cf5:
  Label = *pRect;
  CUIRect::VMargin(&Label,5.0,&Label);
  iVar2 = 4;
  CUI::DoLabel(&this->m_UI,&Label,pText,10.0,4,-1.0,true);
  iVar2 = DoButton_Editor_Common(this,pID,pText_00,iVar2,pRect,Flags,pToolTip);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_File(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	if(Checked)
		pRect->Draw(GetButtonColor(pID, Checked), 3.0f);
	else if(UI()->HotItem() == pID)
		pRect->Draw(vec4(1,1,1,0.33f), 3.0f);

	CUIRect Label = *pRect;
	Label.VMargin(5.0f, &Label);
	UI()->DoLabel(&Label, pText, 10.0f, TEXTALIGN_ML);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}